

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::Matchers::Impl::StdString::StartsWith::match(StartsWith *this,string *expr)

{
  bool bVar1;
  string local_38;
  
  CasedString::adjustString(&local_38,&this->m_data,expr);
  bVar1 = startsWith(&local_38,&(this->m_data).m_str);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return startsWith( m_data.adjustString( expr ), m_data.m_str );
            }